

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.hpp
# Opt level: O0

ostream * just::console::impl::operator<<(ostream *o_,color<void> c_)

{
  bool bVar1;
  ostream *o__local;
  color<void> c__local;
  
  o__local._4_4_ = c_._id;
  bVar1 = color<void>::operator==((color<void> *)((long)&o__local + 4),color<void>::black);
  if (bVar1) {
    std::operator<<(o_,"black");
  }
  else {
    bVar1 = color<void>::operator==((color<void> *)((long)&o__local + 4),color<void>::red);
    if (bVar1) {
      std::operator<<(o_,"red");
    }
    else {
      bVar1 = color<void>::operator==((color<void> *)((long)&o__local + 4),color<void>::green);
      if (bVar1) {
        std::operator<<(o_,"green");
      }
      else {
        bVar1 = color<void>::operator==((color<void> *)((long)&o__local + 4),color<void>::yellow);
        if (bVar1) {
          std::operator<<(o_,"yellow");
        }
        else {
          bVar1 = color<void>::operator==((color<void> *)((long)&o__local + 4),color<void>::blue);
          if (bVar1) {
            std::operator<<(o_,"blue");
          }
          else {
            bVar1 = color<void>::operator==
                              ((color<void> *)((long)&o__local + 4),color<void>::magenta);
            if (bVar1) {
              std::operator<<(o_,"magenta");
            }
            else {
              bVar1 = color<void>::operator==
                                ((color<void> *)((long)&o__local + 4),color<void>::cyan);
              if (bVar1) {
                std::operator<<(o_,"cyan");
              }
              else {
                bVar1 = color<void>::operator==
                                  ((color<void> *)((long)&o__local + 4),color<void>::gray);
                if (bVar1) {
                  std::operator<<(o_,"gray");
                }
                else {
                  bVar1 = color<void>::operator==
                                    ((color<void> *)((long)&o__local + 4),color<void>::bright_red);
                  if (bVar1) {
                    std::operator<<(o_,"bright_red");
                  }
                  else {
                    bVar1 = color<void>::operator==
                                      ((color<void> *)((long)&o__local + 4),
                                       color<void>::bright_green);
                    if (bVar1) {
                      std::operator<<(o_,"bright_green");
                    }
                    else {
                      bVar1 = color<void>::operator==
                                        ((color<void> *)((long)&o__local + 4),
                                         color<void>::bright_yellow);
                      if (bVar1) {
                        std::operator<<(o_,"bright_yellow");
                      }
                      else {
                        bVar1 = color<void>::operator==
                                          ((color<void> *)((long)&o__local + 4),
                                           color<void>::bright_blue);
                        if (bVar1) {
                          std::operator<<(o_,"bright_blue");
                        }
                        else {
                          bVar1 = color<void>::operator==
                                            ((color<void> *)((long)&o__local + 4),
                                             color<void>::bright_magenta);
                          if (bVar1) {
                            std::operator<<(o_,"bright_magenta");
                          }
                          else {
                            bVar1 = color<void>::operator==
                                              ((color<void> *)((long)&o__local + 4),
                                               color<void>::bright_cyan);
                            if (bVar1) {
                              std::operator<<(o_,"bright_cyan");
                            }
                            else {
                              bVar1 = color<void>::operator==
                                                ((color<void> *)((long)&o__local + 4),
                                                 color<void>::white);
                              if (!bVar1) {
                                __assert_fail("!\"Invalid color value\"",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/include/just/console.hpp"
                                              ,0x54,
                                              "std::ostream &just::console::impl::operator<<(std::ostream &, color<T>) [T = void]"
                                             );
                              }
                              std::operator<<(o_,"white");
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return o_;
}

Assistant:

std::ostream& operator<<(std::ostream& o_, color<T> c_)
      {
             if (c_ == color<T>::black)          { o_ << "black"; }
        else if (c_ == color<T>::red)            { o_ << "red"; }
        else if (c_ == color<T>::green)          { o_ << "green"; }
        else if (c_ == color<T>::yellow)         { o_ << "yellow"; }
        else if (c_ == color<T>::blue)           { o_ << "blue"; }
        else if (c_ == color<T>::magenta)        { o_ << "magenta"; }
        else if (c_ == color<T>::cyan)           { o_ << "cyan"; }
        else if (c_ == color<T>::gray)           { o_ << "gray"; }
        else if (c_ == color<T>::bright_red)     { o_ << "bright_red"; }
        else if (c_ == color<T>::bright_green)   { o_ << "bright_green"; }
        else if (c_ == color<T>::bright_yellow)  { o_ << "bright_yellow"; }
        else if (c_ == color<T>::bright_blue)    { o_ << "bright_blue"; }
        else if (c_ == color<T>::bright_magenta) { o_ << "bright_magenta"; }
        else if (c_ == color<T>::bright_cyan)    { o_ << "bright_cyan"; }
        else if (c_ == color<T>::white)          { o_ << "white"; }
        else { assert(!"Invalid color value"); }
  
        return o_;
      }